

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

void __thiscall
cnn::RNNBuilder::start_new_sequence
          (RNNBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *h_0)

{
  RNNState RVar1;
  pointer pRVar2;
  
  RVar1 = (this->sm).q_;
  if (RVar1 != GRAPH_READY) {
    if (RVar1 != CREATED) goto LAB_001871fd;
    RNNStateMachine::failure(&this->sm,start_new_sequence);
  }
  (this->sm).q_ = READING_INPUT;
LAB_001871fd:
  (this->cur).t = -1;
  pRVar2 = (this->head).super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->head).super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar2) {
    (this->head).super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar2;
  }
  (*this->_vptr_RNNBuilder[10])(this,h_0);
  return;
}

Assistant:

void start_new_sequence(const std::vector<Expression>& h_0={}) {
    sm.transition(RNNOp::start_new_sequence);
    cur = RNNPointer(-1);
    head.clear();
    start_new_sequence_impl(h_0);
  }